

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::IfConversion::GetIncomingValue
          (IfConversion *this,Instruction *phi,uint32_t predecessor)

{
  IRContext *this_00;
  DefUseManager *this_01;
  uint32_t id;
  Instruction *pIVar1;
  uint uVar2;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar2 = (phi->has_result_id_ & 1) + 1;
  if (phi->has_type_id_ == false) {
    uVar2 = (uint)phi->has_result_id_;
  }
  id = Instruction::GetSingleWordOperand(phi,uVar2 + predecessor * 2);
  pIVar1 = analysis::DefUseManager::GetDef(this_01,id);
  return pIVar1;
}

Assistant:

Instruction* IfConversion::GetIncomingValue(Instruction* phi,
                                            uint32_t predecessor) {
  uint32_t in_index = 2 * predecessor;
  return get_def_use_mgr()->GetDef(phi->GetSingleWordInOperand(in_index));
}